

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O3

LoadStatus __thiscall DepsLog::Load(DepsLog *this,string *path,State *state,string *err)

{
  pointer *pppNVar1;
  iterator __position;
  pointer ppNVar2;
  Node *pNVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  Metrics *this_00;
  string *psVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  FILE *__stream;
  char *pcVar9;
  size_t sVar10;
  size_t size;
  Deps *deps;
  Node **ppNVar11;
  int *piVar12;
  char *pcVar13;
  LoadStatus LVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  StringPiece path_00;
  int version;
  Node *node;
  ScopedMetric metrics_h_scoped;
  char buf [524288];
  int iStack_80088;
  uint uStack_80084;
  string *psStack_80080;
  ulong uStack_80078;
  int iStack_80070;
  int iStack_8006c;
  string *psStack_80068;
  vector<Node*,std::allocator<Node*>> *pvStack_80060;
  State *pSStack_80058;
  Node *pNStack_80050;
  ScopedMetric SStack_80048;
  string asStack_80038 [16384];
  
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)CONCAT44(asStack_80038[0]._M_dataplus._M_p._4_4_,
                       (int)asStack_80038[0]._M_dataplus._M_p);
  if (Load(std::__cxx11::string_const&,State*,std::__cxx11::string*)::metrics_h_metric == '\0') {
    iVar8 = __cxa_guard_acquire(&Load(std::__cxx11::string_const&,State*,std::__cxx11::string*)::
                                 metrics_h_metric);
    this_00 = g_metrics;
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)CONCAT44(asStack_80038[0]._M_dataplus._M_p._4_4_,
                         (int)asStack_80038[0]._M_dataplus._M_p);
    if (iVar8 != 0) {
      if (g_metrics == (Metrics *)0x0) {
        Load::metrics_h_metric = (Metric *)0x0;
      }
      else {
        paVar4 = &asStack_80038[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)asStack_80038,".ninja_deps load","");
        Load::metrics_h_metric = Metrics::NewMetric(this_00,asStack_80038);
      }
      __cxa_guard_release(&Load(std::__cxx11::string_const&,State*,std::__cxx11::string*)::
                           metrics_h_metric);
    }
  }
  ScopedMetric::ScopedMetric(&SStack_80048,Load::metrics_h_metric);
  __stream = fopen((path->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    piVar12 = __errno_location();
    LVar14 = LOAD_NOT_FOUND;
    if (*piVar12 != 2) {
      pcVar13 = strerror(*piVar12);
      pcVar9 = (char *)err->_M_string_length;
      strlen(pcVar13);
      LVar14 = LOAD_ERROR;
      std::__cxx11::string::_M_replace((ulong)err,0,pcVar9,(ulong)pcVar13);
    }
    goto LAB_00111874;
  }
  iStack_80088 = 0;
  pcVar9 = fgets((char *)asStack_80038,0x80000,__stream);
  if (pcVar9 == (char *)0x0) {
LAB_00111844:
    pcVar9 = "bad deps log signature or version; starting over";
  }
  else {
    sVar10 = fread(&iStack_80088,4,1,__stream);
    if ((sVar10 != 0) &&
       (asStack_80038[0]._M_dataplus._M_p._5_3_ = (undefined3)((ulong)paVar4 >> 0x28),
       iStack_80088 == 4 &&
       (CONCAT17(asStack_80038[0]._M_string_length._4_1_,
                 CONCAT43((undefined4)asStack_80038[0]._M_string_length,
                          asStack_80038[0]._M_dataplus._M_p._5_3_)) == 0xa73706564616a &&
       paVar4 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x64616a6e696e2023))) {
      psStack_80080 = err;
      pSStack_80058 = state;
      size = ftell(__stream);
      sVar10 = fread(&uStack_80084,4,1,__stream);
      psStack_80068 = path;
      if (sVar10 == 0) {
        iVar17 = 0;
        iVar8 = 0;
      }
      else {
        pvStack_80060 = (vector<Node*,std::allocator<Node*>> *)&this->nodes_;
        uStack_80078 = 0;
        iVar17 = 0;
        do {
          uVar16 = uStack_80084;
          uVar18 = uStack_80084 & 0x7fffffff;
          if (0x7ffff < uVar18) goto LAB_001118c5;
          sVar10 = fread(asStack_80038,(ulong)uVar18,1,__stream);
          asStack_80038[0]._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar4 >> 0x20);
          asStack_80038[0]._M_dataplus._M_p._0_4_ = (int)paVar4;
          if (sVar10 == 0) goto LAB_001118c5;
          if ((int)uVar16 < 0) {
            if ((uVar16 & 3) != 0) {
              __assert_fail("size % 4 == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log.cc"
                            ,0xce,"LoadStatus DepsLog::Load(const string &, State *, string *)");
            }
            iStack_8006c = (int)asStack_80038[0]._M_dataplus._M_p;
            iStack_80070 = iVar17;
            deps = (Deps *)operator_new(0x18);
            uVar16 = (uVar18 >> 2) - 3;
            deps->mtime = CONCAT44((undefined4)asStack_80038[0]._M_string_length,
                                   asStack_80038[0]._M_dataplus._M_p._4_4_);
            deps->node_count = uVar16;
            uVar15 = (ulong)uVar16 << 3;
            if (uVar18 < 0xc) {
              uVar15 = 0xffffffffffffffff;
            }
            ppNVar11 = (Node **)operator_new__(uVar15);
            deps->nodes = ppNVar11;
            if (0xc < uVar18) {
              if ((int)uVar16 < 2) {
                uVar16 = 1;
              }
              uVar15 = 0;
              do {
                iVar8 = *(int *)((long)&asStack_80038[0]._M_string_length + uVar15 * 4 + 4);
                ppNVar2 = (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                          .super__Vector_impl_data._M_start;
                if ((int)((ulong)((long)(this->nodes_).
                                        super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)ppNVar2) >> 3) <=
                    iVar8) {
                  __assert_fail("deps_data[i] < (int)nodes_.size()",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log.cc"
                                ,0xd9,"LoadStatus DepsLog::Load(const string &, State *, string *)")
                  ;
                }
                pNVar3 = ppNVar2[iVar8];
                if (pNVar3 == (Node *)0x0) {
                  __assert_fail("nodes_[deps_data[i]]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log.cc"
                                ,0xda,"LoadStatus DepsLog::Load(const string &, State *, string *)")
                  ;
                }
                deps->nodes[uVar15] = pNVar3;
                uVar15 = uVar15 + 1;
              } while (uVar16 != uVar15);
            }
            bVar6 = UpdateDeps(this,iStack_8006c,deps);
            iVar17 = iStack_80070 + 1;
            uStack_80078 = (ulong)((int)uStack_80078 + (uint)!bVar6);
          }
          else {
            if (uVar18 < 5) {
              __assert_fail("path_size > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log.cc"
                            ,0xe3,"LoadStatus DepsLog::Load(const string &, State *, string *)");
            }
            uVar16 = uVar18 - 4;
            if (*(char *)((long)&asStack_80038[0]._M_dataplus._M_p + (ulong)(uVar18 - 5)) == '\0') {
              uVar16 = uVar18 - 5;
            }
            if (*(char *)((long)asStack_80038 + (long)(int)uVar16 + -1) == '\0') {
              uVar16 = uVar16 - 1;
            }
            if (*(char *)((long)asStack_80038 + (long)(int)uVar16 + -1) == '\0') {
              uVar16 = uVar16 - 1;
            }
            path_00.len_ = (size_t)(int)uVar16;
            path_00.str_ = (char *)asStack_80038;
            pNStack_80050 = State::GetNode(pSStack_80058,path_00,0);
            __position._M_current =
                 (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            uVar16 = (uint)((ulong)((long)__position._M_current -
                                   (long)(this->nodes_).
                                         super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                                         .super__Vector_impl_data._M_start) >> 3);
            if ((*(uint *)((long)asStack_80038 + ((ulong)uVar18 - 4)) ^ uVar16) != 0xffffffff)
            goto LAB_001118c5;
            if (-1 < pNStack_80050->id_) {
              __assert_fail("node->id() < 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log.cc"
                            ,0xfc,"LoadStatus DepsLog::Load(const string &, State *, string *)");
            }
            pNStack_80050->id_ = uVar16;
            if (__position._M_current ==
                (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                        (pvStack_80060,__position,&pNStack_80050);
            }
            else {
              *__position._M_current = pNStack_80050;
              pppNVar1 = &(this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                          .super__Vector_impl_data._M_finish;
              *pppNVar1 = *pppNVar1 + 1;
            }
          }
          size = ftell(__stream);
          sVar10 = fread(&uStack_80084,4,1,__stream);
        } while (sVar10 != 0);
        iVar8 = (int)uStack_80078 * 3;
      }
      iVar7 = feof(__stream);
      if (iVar7 == 0) {
LAB_001118c5:
        iVar8 = ferror(__stream);
        if (iVar8 == 0) {
          std::__cxx11::string::_M_replace
                    ((ulong)psStack_80080,0,(char *)psStack_80080->_M_string_length,0x12104f);
        }
        else {
          pcVar13 = strerror(iVar8);
          psVar5 = psStack_80080;
          pcVar9 = (char *)psStack_80080->_M_string_length;
          strlen(pcVar13);
          std::__cxx11::string::_M_replace((ulong)psVar5,0,pcVar9,(ulong)pcVar13);
        }
        fclose(__stream);
        bVar6 = Truncate(psStack_80068,size,psStack_80080);
        LVar14 = LOAD_ERROR;
        if (bVar6) {
          LVar14 = LOAD_SUCCESS;
          std::__cxx11::string::append((char *)psStack_80080);
        }
      }
      else {
        fclose(__stream);
        LVar14 = LOAD_SUCCESS;
        if ((1000 < iVar17) && (iVar8 < iVar17)) {
          this->needs_recompaction_ = true;
        }
      }
      goto LAB_00111874;
    }
    if (iStack_80088 != 1) goto LAB_00111844;
    pcVar9 = "deps log version change; rebuilding";
  }
  std::__cxx11::string::_M_replace((ulong)err,0,(char *)err->_M_string_length,(ulong)pcVar9);
  fclose(__stream);
  unlink((path->_M_dataplus)._M_p);
  LVar14 = LOAD_SUCCESS;
LAB_00111874:
  ScopedMetric::~ScopedMetric(&SStack_80048);
  return LVar14;
}

Assistant:

LoadStatus DepsLog::Load(const string& path, State* state, string* err) {
  METRIC_RECORD(".ninja_deps load");
  char buf[kMaxRecordSize + 1];
  FILE* f = fopen(path.c_str(), "rb");
  if (!f) {
    if (errno == ENOENT)
      return LOAD_NOT_FOUND;
    *err = strerror(errno);
    return LOAD_ERROR;
  }

  bool valid_header = true;
  int version = 0;
  if (!fgets(buf, sizeof(buf), f) || fread(&version, 4, 1, f) < 1)
    valid_header = false;
  // Note: For version differences, this should migrate to the new format.
  // But the v1 format could sometimes (rarely) end up with invalid data, so
  // don't migrate v1 to v3 to force a rebuild. (v2 only existed for a few days,
  // and there was no release with it, so pretend that it never happened.)
  if (!valid_header || strcmp(buf, kFileSignature) != 0 ||
      version != kCurrentVersion) {
    if (version == 1)
      *err = "deps log version change; rebuilding";
    else
      *err = "bad deps log signature or version; starting over";
    fclose(f);
    unlink(path.c_str());
    // Don't report this as a failure.  An empty deps log will cause
    // us to rebuild the outputs anyway.
    return LOAD_SUCCESS;
  }

  long offset;
  bool read_failed = false;
  int unique_dep_record_count = 0;
  int total_dep_record_count = 0;
  for (;;) {
    offset = ftell(f);

    unsigned size;
    if (fread(&size, 4, 1, f) < 1) {
      if (!feof(f))
        read_failed = true;
      break;
    }
    bool is_deps = (size >> 31) != 0;
    size = size & 0x7FFFFFFF;

    if (size > kMaxRecordSize || fread(buf, size, 1, f) < 1) {
      read_failed = true;
      break;
    }

    if (is_deps) {
      assert(size % 4 == 0);
      int* deps_data = reinterpret_cast<int*>(buf);
      int out_id = deps_data[0];
      TimeStamp mtime;
      mtime = (TimeStamp)(((uint64_t)(unsigned int)deps_data[2] << 32) |
                          (uint64_t)(unsigned int)deps_data[1]);
      deps_data += 3;
      int deps_count = (size / 4) - 3;

      Deps* deps = new Deps(mtime, deps_count);
      for (int i = 0; i < deps_count; ++i) {
        assert(deps_data[i] < (int)nodes_.size());
        assert(nodes_[deps_data[i]]);
        deps->nodes[i] = nodes_[deps_data[i]];
      }

      total_dep_record_count++;
      if (!UpdateDeps(out_id, deps))
        ++unique_dep_record_count;
    } else {
      int path_size = size - 4;
      assert(path_size > 0);  // CanonicalizePath() rejects empty paths.
      // There can be up to 3 bytes of padding.
      if (buf[path_size - 1] == '\0') --path_size;
      if (buf[path_size - 1] == '\0') --path_size;
      if (buf[path_size - 1] == '\0') --path_size;
      StringPiece subpath(buf, path_size);
      // It is not necessary to pass in a correct slash_bits here. It will
      // either be a Node that's in the manifest (in which case it will already
      // have a correct slash_bits that GetNode will look up), or it is an
      // implicit dependency from a .d which does not affect the build command
      // (and so need not have its slashes maintained).
      Node* node = state->GetNode(subpath, 0);

      // Check that the expected index matches the actual index. This can only
      // happen if two ninja processes write to the same deps log concurrently.
      // (This uses unary complement to make the checksum look less like a
      // dependency record entry.)
      unsigned checksum = *reinterpret_cast<unsigned*>(buf + size - 4);
      int expected_id = ~checksum;
      int id = nodes_.size();
      if (id != expected_id) {
        read_failed = true;
        break;
      }

      assert(node->id() < 0);
      node->set_id(id);
      nodes_.push_back(node);
    }
  }

  if (read_failed) {
    // An error occurred while loading; try to recover by truncating the
    // file to the last fully-read record.
    if (ferror(f)) {
      *err = strerror(ferror(f));
    } else {
      *err = "premature end of file";
    }
    fclose(f);

    if (!Truncate(path, offset, err))
      return LOAD_ERROR;

    // The truncate succeeded; we'll just report the load error as a
    // warning because the build can proceed.
    *err += "; recovering";
    return LOAD_SUCCESS;
  }

  fclose(f);

  // Rebuild the log if there are too many dead records.
  int kMinCompactionEntryCount = 1000;
  int kCompactionRatio = 3;
  if (total_dep_record_count > kMinCompactionEntryCount &&
      total_dep_record_count > unique_dep_record_count * kCompactionRatio) {
    needs_recompaction_ = true;
  }

  return LOAD_SUCCESS;
}